

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

void __thiscall
duckdb_shell::ShellState::ExecutePreparedStatement(ShellState *this,sqlite3_stmt *pStmt)

{
  RenderMode mode;
  LargeNumberRendering large_number_rendering;
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  uchar *puVar5;
  size_t max_width;
  uint N;
  size_t max_rows;
  size_type __n;
  ulong uVar6;
  undefined1 local_90 [8];
  RowResult result;
  
  mode = this->cMode;
  if (mode == TRASH) {
    TrashRenderer::TrashRenderer((TrashRenderer *)&result);
    duckdb_shell_sqlite3_print_duckbox
              (pStmt,1,0x50,anon_var_dwarf_4b71df5 + 9,0,'\0','\0',0,(BaseResultRenderer *)&result);
  }
  else {
    if (mode != DUCKBOX) {
      bVar1 = ShellRenderer::IsColumnar(mode);
      if (bVar1) {
        ExecutePreparedStatementColumnar(this,pStmt);
        return;
      }
      iVar2 = duckdb_shell_sqlite3_step(pStmt);
      if (iVar2 != 100) {
        return;
      }
      result.types.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      result.pStmt = (sqlite3_stmt *)0x0;
      result.types.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      result.types.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      result.data.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      result.data.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      result.column_names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      result.data.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      result.column_names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      result.column_names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar3 = duckdb_shell_sqlite3_column_count(pStmt);
      __n = (size_type)(int)uVar3;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve(&result.column_names,__n);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::resize(&result.data,__n);
      std::vector<int,_std::allocator<int>_>::resize(&result.types,__n);
      N = 0;
      if ((int)uVar3 < 1) {
        uVar3 = 0;
      }
      for (; uVar3 != N; N = N + 1) {
        local_90 = (undefined1  [8])duckdb_shell_sqlite3_column_name(pStmt,N);
        std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&result,(char **)local_90);
      }
      result.pStmt = pStmt;
      GetRowRenderer((ShellState *)local_90);
      uVar6 = 0;
      do {
        for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
          iVar2 = duckdb_shell_sqlite3_column_type(pStmt,(int)uVar6);
          result.types.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[uVar6] = iVar2;
          puVar5 = duckdb_shell_sqlite3_column_text(pStmt,(int)uVar6);
          result.data.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] = (char *)puVar5;
          if ((result.data.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6] == (char *)0x0) &&
             (result.types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6] != 5)) goto LAB_001e252f;
        }
        if (result.data.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            result.data.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          (**(code **)((long)(((unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>
                                *)local_90)->
                             super_unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>)
                             ._M_t.
                             super___uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::DuckDB_*,_std::default_delete<duckdb::DuckDB>_>
                             .super__Head_base<0UL,_duckdb::DuckDB_*,_false> + 0x10))
                    (local_90,&result);
        }
        iVar2 = duckdb_shell_sqlite3_step(pStmt);
        uVar6 = 0;
      } while (iVar2 == 100);
LAB_001e252f:
      (**(code **)((long)(((unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true> *)
                          local_90)->
                         super_unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>).
                         _M_t.
                         super___uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::DuckDB_*,_std::default_delete<duckdb::DuckDB>_>
                         .super__Head_base<0UL,_duckdb::DuckDB_*,_false> + 0x28))(local_90,&result);
      if (local_90 != (undefined1  [8])0x0) {
        (**(code **)((long)(((unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>
                              *)local_90)->
                           super_unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>).
                           _M_t.
                           super___uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::DuckDB_*,_std::default_delete<duckdb::DuckDB>_>
                           .super__Head_base<0UL,_duckdb::DuckDB_*,_false> + 8))();
      }
      RowResult::~RowResult(&result);
      return;
    }
    max_width = 0xffffffffffffffff;
    sVar4 = this->max_width;
    max_rows = this->max_rows;
    if (((this->outfile)._M_string_length != 0) && (*(this->outfile)._M_dataplus._M_p != '|')) {
      sVar4 = max_width;
      max_rows = max_width;
    }
    if (stdout_is_console != NONE) {
      max_width = sVar4;
    }
    large_number_rendering = this->large_number_rendering;
    if (this->large_number_rendering == DEFAULT) {
      large_number_rendering = (uint)stdout_is_console;
    }
    bVar1 = highlight_results == ON;
    if (highlight_results == DEFAULT) {
      bVar1 = stdout_is_console;
    }
    DuckBoxRenderer::DuckBoxRenderer((DuckBoxRenderer *)&result,this,bVar1);
    duckdb_shell_sqlite3_print_duckbox
              (pStmt,max_rows,max_width,(this->nullValue)._M_dataplus._M_p,this->columns,
               this->thousand_separator,this->decimal_separator,large_number_rendering,
               (BaseResultRenderer *)&result);
  }
  duckdb::BaseResultRenderer::~BaseResultRenderer((BaseResultRenderer *)&result);
  return;
}

Assistant:

void ShellState::ExecutePreparedStatement(sqlite3_stmt *pStmt) {
	if (cMode == RenderMode::DUCKBOX) {
		size_t max_rows = this->max_rows;
		size_t max_width = this->max_width;
		if (!outfile.empty() && outfile[0] != '|') {
			max_rows = (size_t)-1;
			max_width = (size_t)-1;
		}
		LargeNumberRendering large_rendering = large_number_rendering;
		if (!stdout_is_console) {
			max_width = (size_t)-1;
		}
		if (large_rendering == LargeNumberRendering::DEFAULT) {
			large_rendering = stdout_is_console ? LargeNumberRendering::FOOTER : LargeNumberRendering::NONE;
		}

		DuckBoxRenderer renderer(*this, HighlightResults());
		sqlite3_print_duckbox(pStmt, max_rows, max_width, nullValue.c_str(), columns, thousand_separator,
		                      decimal_separator, int(large_rendering), &renderer);
		return;
	}
	if (cMode == RenderMode::TRASH) {
		TrashRenderer renderer;
		sqlite3_print_duckbox(pStmt, 1, 80, "", false, '\0', '\0', 0, &renderer);
		return;
	}

	if (ShellRenderer::IsColumnar(cMode)) {
		ExecutePreparedStatementColumnar(pStmt);
		return;
	}

	/* perform the first step.  this will tell us if we
	** have a result set or not and how wide it is.
	*/
	int rc = sqlite3_step(pStmt);
	/* if we have a result set... */
	if (SQLITE_ROW != rc) {
		return;
	}
	RowResult result;
	// initialize the result and the column names
	int nCol = sqlite3_column_count(pStmt);
	result.column_names.reserve(nCol);
	result.data.resize(nCol);
	result.types.resize(nCol);
	for (int i = 0; i < nCol; i++) {
		result.column_names.push_back(sqlite3_column_name(pStmt, i));
	}
	result.pStmt = pStmt;

	auto renderer = GetRowRenderer();

	// iterate over the rows
	do {
		/* extract the data and data types */
		for (int i = 0; i < nCol; i++) {
			result.types[i] = sqlite3_column_type(pStmt, i);
			result.data[i] = (const char *)sqlite3_column_text(pStmt, i);
			if (!result.data[i] && result.types[i] != SQLITE_NULL) {
				// OOM
				rc = SQLITE_NOMEM;
				break;
			}
		}

		/* if data and types extracted successfully... */
		if (SQLITE_ROW == rc) {
			/* call the supplied callback with the result row data */
			if (RenderRow(*renderer, result)) {
				rc = SQLITE_ABORT;
			} else {
				rc = sqlite3_step(pStmt);
			}
		}
	} while (SQLITE_ROW == rc);

	renderer->RenderFooter(result);
}